

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>,false>
          (Thread *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Value VVar10;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  VVar10 = Pop(this);
  uVar1 = VVar10._8_8_;
  auVar9._8_6_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xe] = VVar10._15_1_;
  auVar9[0xf] = VVar10._15_1_;
  auVar8._14_2_ = auVar9._14_2_;
  auVar8._8_5_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xd] = VVar10._14_1_;
  auVar7._13_3_ = auVar8._13_3_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[0xc] = VVar10._14_1_;
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._8_3_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xb] = VVar10._13_1_;
  auVar5._11_5_ = auVar6._11_5_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = VVar10._13_1_;
  auVar4._10_6_ = auVar5._10_6_;
  auVar4[8] = 0;
  auVar4._0_8_ = uVar1;
  auVar4[9] = VVar10._12_1_;
  auVar3._9_7_ = auVar4._9_7_;
  auVar3[8] = VVar10._12_1_;
  auVar3._0_8_ = uVar1;
  auVar2._8_8_ = auVar3._8_8_;
  auVar2[7] = VVar10._11_1_;
  auVar2[6] = VVar10._11_1_;
  auVar2[5] = VVar10._10_1_;
  auVar2[4] = VVar10._10_1_;
  auVar2[3] = VVar10._9_1_;
  auVar2[2] = VVar10._9_1_;
  auVar2[0] = VVar10._8_1_;
  auVar2[1] = auVar2[0];
  VVar10 = (Value)psraw(auVar2,8);
  Push(this,VVar10);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}